

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O0

RatiotestResult
ratiotest_twopass(Runtime *runtime,QpVector *p,QpVector *rowmove,Instance *relaxed,double alphastart
                 )

{
  const_reference pvVar1;
  reference pvVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar3;
  RatiotestResult RVar4;
  double step_i_1;
  HighsInt i_1;
  double step_i;
  HighsInt i;
  double max_pivot;
  RatiotestResult res1;
  RatiotestResult result;
  double in_stack_ffffffffffffff68;
  value_type t;
  double in_stack_ffffffffffffff70;
  value_type u;
  value_type in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff88;
  int local_64;
  double in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar5;
  int iVar6;
  QpVector *in_stack_ffffffffffffffb0;
  value_type vVar7;
  undefined1 in_stack_ffffffffffffffb8 [16];
  double local_10;
  int local_8;
  undefined4 uStack_4;
  
  RVar4 = ratiotest_textbook(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_,
                             in_stack_ffffffffffffffb0,
                             (Instance *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa0);
  local_8 = RVar4.limitingconstraint;
  local_10 = RVar4.alpha;
  uStack_4 = RVar4._12_4_;
  if (local_8 != -1) {
    vVar7 = 0.0;
    if (local_8 != -1) {
      if (local_8 < *(int *)(in_RDI + 8)) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)local_8
                           );
        vVar7 = *pvVar1;
      }
      else {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)(local_8 - *(int *)(in_RDI + 8)));
        vVar7 = *pvVar1;
      }
    }
    iVar5 = 0;
    while (iVar5 < *(int *)(in_RDI + 8)) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x938),(long)iVar5);
      in_stack_ffffffffffffff78 = *pvVar2;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar5);
      in_stack_ffffffffffffff80 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)iVar5);
      in_stack_ffffffffffffff88 = *pvVar2;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x110),(long)iVar5);
      dVar3 = step(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar5);
      iVar6 = iVar5;
      if ((ABS(vVar7) <= ABS(*pvVar1)) && (dVar3 <= RVar4.alpha)) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar5);
        vVar7 = *pvVar1;
        iVar6 = iVar5;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar5);
        uStack_4 = CONCAT31(uStack_4._1_3_,*pvVar1 <= 0.0 && *pvVar1 != 0.0);
        local_10 = dVar3;
        local_8 = iVar5;
      }
      iVar5 = iVar6 + 1;
    }
    for (local_64 = 0; local_64 < *(int *)(in_RDI + 4); local_64 = local_64 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x900),(long)local_64);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_64)
      ;
      t = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1d0),(long)local_64
                         );
      u = *pvVar2;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),(long)local_64);
      dVar3 = step(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,u,t
                  );
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_64)
      ;
      if ((ABS(vVar7) <= ABS(*pvVar1)) && (dVar3 <= RVar4.alpha)) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)local_64);
        vVar7 = *pvVar1;
        local_8 = *(int *)(in_RDI + 8) + local_64;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)local_64);
        uStack_4 = CONCAT31(uStack_4._1_3_,*pvVar1 <= 0.0 && *pvVar1 != 0.0);
        local_10 = dVar3;
      }
    }
    if (local_10 <= 0.0) {
      local_10 = 0.0;
    }
  }
  RVar4.limitingconstraint = local_8;
  RVar4.alpha = local_10;
  RVar4._12_4_ = uStack_4;
  return RVar4;
}

Assistant:

static RatiotestResult ratiotest_twopass(Runtime& runtime, const QpVector& p,
                                         const QpVector& rowmove,
                                         Instance& relaxed,
                                         const double alphastart) {
  RatiotestResult res1 =
      ratiotest_textbook(runtime, p, rowmove, relaxed, alphastart);

  if (res1.limitingconstraint == -1) {
    return res1;
  }

  RatiotestResult result = res1;

  double max_pivot = 0;
  if (res1.limitingconstraint != -1) {
    if ((int)result.limitingconstraint < runtime.instance.num_con) {
      max_pivot = rowmove.value[result.limitingconstraint];
    } else {
      max_pivot = p.value[result.limitingconstraint - runtime.instance.num_con];
    }
  }

  for (HighsInt i = 0; i < runtime.instance.num_con; i++) {
    double step_i = step(runtime.rowactivity.value[i], rowmove.value[i],
                         runtime.instance.con_lo[i], runtime.instance.con_up[i],
                         runtime.settings.ratiotest_t);
    if (fabs(rowmove.value[i]) >= fabs(max_pivot) && step_i <= res1.alpha) {
      max_pivot = rowmove.value[i];
      result.limitingconstraint = i;
      result.alpha = step_i;
      result.nowactiveatlower = rowmove.value[i] < 0;
    }
  }

  for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
    double step_i =
        step(runtime.primal.value[i], p.value[i], runtime.instance.var_lo[i],
             runtime.instance.var_up[i], runtime.settings.ratiotest_t);
    if (fabs(p.value[i]) >= fabs(max_pivot) && step_i <= res1.alpha) {
      max_pivot = p.value[i];
      result.limitingconstraint = runtime.instance.num_con + i;
      result.alpha = step_i;
      result.nowactiveatlower = p.value[i] < 0;
    }
  }

  result.alpha = fmax(result.alpha, 0.0);
  return result;
}